

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_file_writer_teardown_close(mpack_writer_t *writer)

{
  int iVar1;
  int ret;
  FILE *file;
  mpack_writer_t *writer_local;
  
  if (((FILE *)writer->context != (FILE *)0x0) &&
     (iVar1 = fclose((FILE *)writer->context), iVar1 != 0)) {
    mpack_writer_flag_error(writer,mpack_error_io);
  }
  mpack_file_writer_teardown(writer);
  return;
}

Assistant:

static void mpack_file_writer_teardown_close(mpack_writer_t* writer) {
    FILE* file = (FILE*)writer->context;

    if (file) {
        int ret = fclose(file);
        if (ret != 0)
            mpack_writer_flag_error(writer, mpack_error_io);
    }

    mpack_file_writer_teardown(writer);
}